

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<Visitor&>
          (ReplicatedAssignmentPatternExpression *this,Result *visitor)

{
  Expression *in_RSI;
  ReplicatedAssignmentPatternExpression *in_RDI;
  Result *in_stack_00000018;
  AssignmentPatternExpressionBase *in_stack_00000020;
  
  count(in_RDI);
  Expression::visit<Visitor&>(in_RSI,(Result *)in_RDI);
  AssignmentPatternExpressionBase::visitExprs<Visitor&>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }